

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

UtcTimeStamp * __thiscall
FIX::UtcTimeStampField::getValue(UtcTimeStamp *__return_storage_ptr__,UtcTimeStampField *this)

{
  string *value;
  FieldConvertError *anon_var_0;
  UtcTimeStampField *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  UtcTimeStampConvertor::convert(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return UtcTimeStampConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }